

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
FxColorLiteral::FxColorLiteral(FxColorLiteral *this,FArgumentList *args,FScriptPosition *sc)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_ColorLiteral,sc);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxColorLiteral_00706dd8;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array = (FxExpression **)0x0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Most = 0;
  (this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Count = 0;
  this->constval = 0;
  TArray<FxExpression_*,_FxExpression_*>::operator=
            (&(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>,
             &args->super_TArray<FxExpression_*,_FxExpression_*>);
  return;
}

Assistant:

FxColorLiteral::FxColorLiteral(FArgumentList &args, FScriptPosition &sc)
	:FxExpression(EFX_ColorLiteral, sc)
{
	ArgList = std::move(args);
}